

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocation.h
# Opt level: O0

void __thiscall mocker::detail::RegisterAllocator::~RegisterAllocator(RegisterAllocator *this)

{
  RegisterAllocator *this_local;
  
  std::
  unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  ::~unordered_set(&this->spilledLastTime);
  MoveInfo::~MoveInfo(&this->moveInfo);
  InterferenceGraph::~InterferenceGraph(&this->interG);
  return;
}

Assistant:

RegisterAllocator(nasm::Section &section, LineIter funcBeg, LineIter funcEnd)
      : section(section), funcBeg(funcBeg), funcEnd(funcEnd) {}